

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacket.cpp
# Opt level: O2

void __thiscall
jrtplib::RTPPacket::RTPPacket(RTPPacket *this,RTPRawPacket *rawpack,RTPMemoryManager *mgr)

{
  int iVar1;
  
  (this->super_RTPMemoryObject).mgr = mgr;
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPPacket_0014ed08;
  (this->receivetime).m_t = (rawpack->receivetime).m_t;
  Clear(this);
  iVar1 = ParseRawPacket(this,rawpack);
  this->error = iVar1;
  return;
}

Assistant:

RTPPacket::RTPPacket(RTPRawPacket &rawpack,RTPMemoryManager *mgr) : RTPMemoryObject(mgr),receivetime(rawpack.GetReceiveTime())
{
	Clear();
	error = ParseRawPacket(rawpack);
}